

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O0

fio_str_info_s * fiobj_obj2cstr(fio_str_info_s *__return_storage_ptr__,FIOBJ o)

{
  fiobj_object_vtable_s *pfVar1;
  fio_str_info_s *ret;
  char local_10;
  FIOBJ o_local;
  
  if (o == 0) {
    __return_storage_ptr__->capa = 0;
    __return_storage_ptr__->len = 4;
    __return_storage_ptr__->data = "null";
  }
  else if ((o & 1) == 0) {
    if ((o & 6) == 6) {
      local_10 = (char)o;
      if (local_10 == '\x06') {
        __return_storage_ptr__->capa = 0;
        __return_storage_ptr__->len = 4;
        __return_storage_ptr__->data = "null";
        return __return_storage_ptr__;
      }
      if (local_10 == '\x16') {
        __return_storage_ptr__->capa = 0;
        __return_storage_ptr__->len = 4;
        __return_storage_ptr__->data = "true";
        return __return_storage_ptr__;
      }
      if (local_10 == '&') {
        __return_storage_ptr__->capa = 0;
        __return_storage_ptr__->len = 5;
        __return_storage_ptr__->data = "false";
        return __return_storage_ptr__;
      }
    }
    pfVar1 = fiobj_type_vtable(o);
    (*pfVar1->to_str)(__return_storage_ptr__,o);
  }
  else {
    fio_ltocstr(__return_storage_ptr__,(long)o >> 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FIO_INLINE fio_str_info_s fiobj_obj2cstr(const FIOBJ o) {
  if (!o) {
    fio_str_info_s ret = {0, 4, (char *)"null"};
    return ret;
  }
  if (o & FIOBJECT_NUMBER_FLAG)
    return fio_ltocstr(((intptr_t)o) >> 1);
  if ((o & FIOBJECT_PRIMITIVE_FLAG) == FIOBJECT_PRIMITIVE_FLAG) {
    switch ((fiobj_type_enum)o) {
    case FIOBJ_T_NULL: {
      fio_str_info_s ret = {0, 4, (char *)"null"};
      return ret;
    }
    case FIOBJ_T_FALSE: {
      fio_str_info_s ret = {0, 5, (char *)"false"};
      return ret;
    }
    case FIOBJ_T_TRUE: {
      fio_str_info_s ret = {0, 4, (char *)"true"};
      return ret;
    }
    default:
      break;
    }
  }
  return FIOBJECT2VTBL(o)->to_str(o);
}